

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O0

void Test_TemplateModifiers_ValidateImgSrcUrlHtmlEscape::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  TemplateString TVar10;
  TemplateString TVar11;
  TemplateString TVar12;
  TemplateString TVar13;
  TemplateString TVar14;
  int iVar15;
  char *pcVar16;
  TemplateString local_350;
  TemplateString local_330;
  TemplateString local_310;
  TemplateString local_2f0;
  TemplateString local_2d0;
  TemplateString local_2b0;
  TemplateString local_290;
  TemplateDictionaryPeer local_270;
  TemplateDictionaryPeer peer;
  size_t sStack_260;
  undefined8 local_258;
  TemplateId TStack_250;
  TemplateString local_248;
  TemplateString local_228;
  TemplateString local_208;
  TemplateString local_1e8;
  TemplateString local_1c8;
  TemplateString local_1a8;
  TemplateString local_188;
  TemplateString local_168;
  TemplateString local_148;
  TemplateString local_128;
  TemplateString local_108;
  TemplateString local_e8;
  TemplateString local_b8;
  TemplateString local_98;
  TemplateDictionary local_78 [8];
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString(&local_98,"TestValidateImgSrcUrlHtmlEscape");
  ctemplate::TemplateDictionary::TemplateDictionary(local_78,&local_98,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_b8,"easy http URL");
  ctemplate::TemplateString::TemplateString(&local_e8,"http://www.google.com");
  TVar1.length_ = local_b8.length_;
  TVar1.ptr_ = local_b8.ptr_;
  TVar1.is_immutable_ = local_b8.is_immutable_;
  TVar1._17_7_ = local_b8._17_7_;
  TVar1.id_ = local_b8.id_;
  TVar8.length_ = local_e8.length_;
  TVar8.ptr_ = local_e8.ptr_;
  TVar8.is_immutable_ = local_e8.is_immutable_;
  TVar8._17_7_ = local_e8._17_7_;
  TVar8.id_ = local_e8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar1,TVar8,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_108,"harder https URL");
  ctemplate::TemplateString::TemplateString(&local_128,"https://www.google.com/search?q=f&hl=en");
  TVar2.length_ = local_108.length_;
  TVar2.ptr_ = local_108.ptr_;
  TVar2.is_immutable_ = local_108.is_immutable_;
  TVar2._17_7_ = local_108._17_7_;
  TVar2.id_ = local_108.id_;
  TVar9.length_ = local_128.length_;
  TVar9.ptr_ = local_128.ptr_;
  TVar9.is_immutable_ = local_128.is_immutable_;
  TVar9._17_7_ = local_128._17_7_;
  TVar9.id_ = local_128.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar2,TVar9,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_148,"easy javascript URL");
  ctemplate::TemplateString::TemplateString(&local_168,"javascript:alert(document.cookie)");
  TVar3.length_ = local_148.length_;
  TVar3.ptr_ = local_148.ptr_;
  TVar3.is_immutable_ = local_148.is_immutable_;
  TVar3._17_7_ = local_148._17_7_;
  TVar3.id_ = local_148.id_;
  TVar10.length_ = local_168.length_;
  TVar10.ptr_ = local_168.ptr_;
  TVar10.is_immutable_ = local_168.is_immutable_;
  TVar10._17_7_ = local_168._17_7_;
  TVar10.id_ = local_168.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar3,TVar10,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_188,"harder javascript URL");
  ctemplate::TemplateString::TemplateString(&local_1a8,"javascript:alert(10/5)");
  TVar4.length_ = local_188.length_;
  TVar4.ptr_ = local_188.ptr_;
  TVar4.is_immutable_ = local_188.is_immutable_;
  TVar4._17_7_ = local_188._17_7_;
  TVar4.id_ = local_188.id_;
  TVar11.length_ = local_1a8.length_;
  TVar11.ptr_ = local_1a8.ptr_;
  TVar11.is_immutable_ = local_1a8.is_immutable_;
  TVar11._17_7_ = local_1a8._17_7_;
  TVar11.id_ = local_1a8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar4,TVar11,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_1c8,"easy relative URL");
  ctemplate::TemplateString::TemplateString(&local_1e8,"foobar.html");
  TVar5.length_ = local_1c8.length_;
  TVar5.ptr_ = local_1c8.ptr_;
  TVar5.is_immutable_ = local_1c8.is_immutable_;
  TVar5._17_7_ = local_1c8._17_7_;
  TVar5.id_ = local_1c8.id_;
  TVar12.length_ = local_1e8.length_;
  TVar12.ptr_ = local_1e8.ptr_;
  TVar12.is_immutable_ = local_1e8.is_immutable_;
  TVar12._17_7_ = local_1e8._17_7_;
  TVar12.id_ = local_1e8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar5,TVar12,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_208,"harder relative URL");
  ctemplate::TemplateString::TemplateString(&local_228,"/search?q=green flowers&hl=en");
  TVar6.length_ = local_208.length_;
  TVar6.ptr_ = local_208.ptr_;
  TVar6.is_immutable_ = local_208.is_immutable_;
  TVar6._17_7_ = local_208._17_7_;
  TVar6.id_ = local_208.id_;
  TVar13.length_ = local_228.length_;
  TVar13.ptr_ = local_228.ptr_;
  TVar13.is_immutable_ = local_228.is_immutable_;
  TVar13._17_7_ = local_228._17_7_;
  TVar13.id_ = local_228.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar6,TVar13,(TemplateModifier *)local_78);
  ctemplate::TemplateString::TemplateString(&local_248,"ftp URL");
  ctemplate::TemplateString::TemplateString
            ((TemplateString *)&peer,"ftp://ftp.example.org/pub/file.txt");
  TVar7.length_ = local_248.length_;
  TVar7.ptr_ = local_248.ptr_;
  TVar7.is_immutable_ = local_248.is_immutable_;
  TVar7._17_7_ = local_248._17_7_;
  TVar7.id_ = local_248.id_;
  TVar14.length_ = sStack_260;
  TVar14.ptr_ = (char *)peer.dict_;
  TVar14._16_8_ = local_258;
  TVar14.id_ = TStack_250;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar7,TVar14,(TemplateModifier *)local_78);
  ctemplate::TemplateDictionaryPeer::TemplateDictionaryPeer(&local_270,local_78);
  ctemplate::TemplateString::TemplateString(&local_290,"easy http URL");
  pcVar16 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_270,&local_290);
  iVar15 = strcmp(pcVar16,"http://www.google.com");
  if (iVar15 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"easy http URL\"), \"http://www.google.com\") == 0");
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_2b0,"harder https URL");
  pcVar16 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_270,&local_2b0);
  iVar15 = strcmp(pcVar16,"https://www.google.com/search?q=f&amp;hl=en");
  if (iVar15 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"harder https URL\"), \"https://www.google.com/search?q=f&amp;hl=en\") == 0"
           );
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_2d0,"easy javascript URL");
  pcVar16 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_270,&local_2d0);
  iVar15 = strcmp(pcVar16,ctemplate::ValidateUrl::kUnsafeImgSrcUrlReplacement);
  if (iVar15 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"easy javascript URL\"), ctemplate::ValidateUrl::kUnsafeImgSrcUrlReplacement) == 0"
           );
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_2f0,"harder javascript URL");
  pcVar16 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_270,&local_2f0);
  iVar15 = strcmp(pcVar16,ctemplate::ValidateUrl::kUnsafeImgSrcUrlReplacement);
  if (iVar15 == 0) {
    ctemplate::TemplateString::TemplateString(&local_310,"easy relative URL");
    pcVar16 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_270,&local_310);
    iVar15 = strcmp(pcVar16,"foobar.html");
    if (iVar15 != 0) {
      fprintf(_stderr,"Check failed: %s\n",
              "strcmp(peer.GetSectionValue(\"easy relative URL\"), \"foobar.html\") == 0");
      exit(1);
    }
    ctemplate::TemplateString::TemplateString(&local_330,"harder relative URL");
    pcVar16 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_270,&local_330);
    iVar15 = strcmp(pcVar16,"/search?q=green flowers&amp;hl=en");
    if (iVar15 == 0) {
      ctemplate::TemplateString::TemplateString(&local_350,"ftp URL");
      pcVar16 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&local_270,&local_350);
      iVar15 = strcmp(pcVar16,"ftp://ftp.example.org/pub/file.txt");
      if (iVar15 == 0) {
        ctemplate::TemplateDictionary::~TemplateDictionary(local_78);
        return;
      }
      fprintf(_stderr,"Check failed: %s\n",
              "strcmp(peer.GetSectionValue(\"ftp URL\"), \"ftp://ftp.example.org/pub/file.txt\") == 0"
             );
      exit(1);
    }
    fprintf(_stderr,"Check failed: %s\n",
            "strcmp(peer.GetSectionValue(\"harder relative URL\"), \"/search?q=green flowers&amp;hl=en\") == 0"
           );
    exit(1);
  }
  fprintf(_stderr,"Check failed: %s\n",
          "strcmp(peer.GetSectionValue(\"harder javascript URL\"), ctemplate::ValidateUrl::kUnsafeImgSrcUrlReplacement) == 0"
         );
  exit(1);
}

Assistant:

TEST(TemplateModifiers, ValidateImgSrcUrlHtmlEscape) {
  GOOGLE_NAMESPACE::TemplateDictionary dict("TestValidateImgSrcUrlHtmlEscape", NULL);
  dict.SetEscapedValue("easy http URL", "http://www.google.com",
                       GOOGLE_NAMESPACE::validate_img_src_url_and_html_escape);
  dict.SetEscapedValue("harder https URL",
                       "https://www.google.com/search?q=f&hl=en",
                       GOOGLE_NAMESPACE::validate_img_src_url_and_html_escape);
  dict.SetEscapedValue("easy javascript URL",
                       "javascript:alert(document.cookie)",
                       GOOGLE_NAMESPACE::validate_img_src_url_and_html_escape);
  dict.SetEscapedValue("harder javascript URL",
                       "javascript:alert(10/5)",
                       GOOGLE_NAMESPACE::validate_img_src_url_and_html_escape);
  dict.SetEscapedValue("easy relative URL",
                       "foobar.html",
                       GOOGLE_NAMESPACE::validate_img_src_url_and_html_escape);
  dict.SetEscapedValue("harder relative URL",
                       "/search?q=green flowers&hl=en",
                       GOOGLE_NAMESPACE::validate_img_src_url_and_html_escape);
  dict.SetEscapedValue("ftp URL",
                       "ftp://ftp.example.org/pub/file.txt",
                       GOOGLE_NAMESPACE::validate_img_src_url_and_html_escape);

  GOOGLE_NAMESPACE::TemplateDictionaryPeer peer(&dict);  // peer can look inside dicts
  EXPECT_STREQ(peer.GetSectionValue("easy http URL"),
               "http://www.google.com");
  EXPECT_STREQ(peer.GetSectionValue("harder https URL"),
               "https://www.google.com/search?q=f&amp;hl=en");
  EXPECT_STREQ(peer.GetSectionValue("easy javascript URL"),
               GOOGLE_NAMESPACE::ValidateUrl::kUnsafeImgSrcUrlReplacement);
  EXPECT_STREQ(peer.GetSectionValue("harder javascript URL"),
               GOOGLE_NAMESPACE::ValidateUrl::kUnsafeImgSrcUrlReplacement);
  EXPECT_STREQ(peer.GetSectionValue("easy relative URL"),
               "foobar.html");
  EXPECT_STREQ(peer.GetSectionValue("harder relative URL"),
               "/search?q=green flowers&amp;hl=en");
  EXPECT_STREQ(peer.GetSectionValue("ftp URL"),
               "ftp://ftp.example.org/pub/file.txt");
}